

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMin.hpp
# Opt level: O0

void __thiscall
StackMin<long,_std::less_equal<long>_>::push(StackMin<long,_std::less_equal<long>_> *this,long *e)

{
  bool bVar1;
  reference __y;
  long *e_local;
  StackMin<long,_std::less_equal<long>_> *this_local;
  
  bVar1 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::empty(&this->min_);
  if (bVar1) {
    std::stack<long,_std::deque<long,_std::allocator<long>_>_>::push(&this->stk_,e);
    std::stack<long,_std::deque<long,_std::allocator<long>_>_>::push(&this->min_,e);
  }
  else {
    std::stack<long,_std::deque<long,_std::allocator<long>_>_>::push(&this->stk_,e);
    __y = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::top(&this->min_);
    bVar1 = std::less_equal<long>::operator()((less_equal<long> *)&this->field_0xa0,e,__y);
    if (bVar1) {
      std::stack<long,_std::deque<long,_std::allocator<long>_>_>::push(&this->min_,e);
    }
  }
  return;
}

Assistant:

void push(const Type& e){
    if (min_.empty()){
      stk_.push(e);
      min_.push(e);
    }
    else{
      stk_.push(e);

      if (cmp_(e, min_.top())){
        min_.push(e);
      }
    }
  }